

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm_codec.c
# Opt level: O1

TPM_RC TPM2_Hash(TSS_DEVICE *tpm,TPM2B_MAX_BUFFER *data,TPMI_ALG_HASH hashAlg,
                TPMI_RH_HIERARCHY hierarchy,TPM2B_DIGEST *outHash,TPMT_TK_HASHCHECK *validation)

{
  ushort uVar1;
  UINT16 UVar2;
  TPM_RC TVar3;
  TPM_RC TVar4;
  INT32 sizeParamBuf;
  BYTE *paramBuf;
  TSS_CMD_CONTEXT CmdCtx;
  INT32 local_30b0;
  TPMI_ALG_HASH local_30aa;
  BYTE *local_30a8;
  TPMI_RH_HIERARCHY local_30a0;
  TPMT_TK_HASHCHECK local_309c;
  TSS_CMD_CONTEXT local_3050;
  
  local_30b0 = 0x1000;
  local_30a8 = local_3050.ParamBuffer;
  local_3050.ParamSize = 0;
  local_30aa = hashAlg;
  local_30a0 = hierarchy;
  if (data == (TPM2B_MAX_BUFFER *)0x0) {
    uVar1 = UINT16_Marshal(&NullSize,&local_30a8,&local_30b0);
  }
  else {
    uVar1 = TPM2B_MAX_BUFFER_Marshal(data,&local_30a8,&local_30b0);
  }
  local_3050.ParamSize = uVar1 + local_3050.ParamSize;
  UVar2 = UINT16_Marshal(&local_30aa,&local_30a8,&local_30b0);
  local_3050.ParamSize = local_3050.ParamSize + UVar2;
  UVar2 = UINT32_Marshal(&local_30a0,&local_30a8,&local_30b0);
  local_3050.ParamSize = local_3050.ParamSize + UVar2;
  TVar3 = TSS_DispatchCmd(tpm,0x17d,(TPM_HANDLE *)0x0,0,(TSS_SESSION **)0x0,0,&local_3050);
  if (TVar3 == 0) {
    TVar4 = TPM2B_DIGEST_Unmarshal
                      (outHash,&local_3050.RespBufPtr,(INT32 *)&local_3050.RespBytesLeft);
    TVar3 = 0x9a;
    if (TVar4 == 0) {
      if (validation == (TPMT_TK_HASHCHECK *)0x0) {
        validation = &local_309c;
      }
      TVar4 = TPMT_TK_HASHCHECK_Unmarshal
                        (validation,&local_3050.RespBufPtr,(INT32 *)&local_3050.RespBytesLeft);
      if (TVar4 == 0) {
        TVar3 = 0;
      }
    }
  }
  return TVar3;
}

Assistant:

TPM_RC
TPM2_Hash(
    TSS_DEVICE             *tpm,                // IN/OUT
    TPM2B_MAX_BUFFER       *data,               // IN
    TPMI_ALG_HASH           hashAlg,            // IN
    TPMI_RH_HIERARCHY       hierarchy,          // IN [opt]
    TPM2B_DIGEST           *outHash,            // OUT
    TPMT_TK_HASHCHECK      *validation          // OUT [opt]
)
{
    TSS_CMD_CONTEXT  CmdCtx;

    BEGIN_CMD();
    TSS_MARSHAL_OPT2B(TPM2B_MAX_BUFFER, data);
    TSS_MARSHAL(TPMI_ALG_HASH, &hashAlg);
    TSS_MARSHAL(TPMI_RH_HIERARCHY, &hierarchy);
    DISPATCH_CMD(Hash, NULL, 0, NULL, 0);
    TSS_UNMARSHAL(TPM2B_DIGEST, outHash);
    TSS_UNMARSHAL_OPT(TPMT_TK_HASHCHECK, validation);
    END_CMD();
}